

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O3

long __thiscall CSIZECommand::GetFileSize(CSIZECommand *this,CClient *pClient)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  ostream *poVar3;
  string local_38;
  
  CClient::GetUserDir_abi_cxx11_(&local_38,pClient);
  iVar1 = chdir(local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (iVar1 == 0) {
    __stream = fopen((this->super_CCommand).m_Args._M_dataplus._M_p,"rb");
    if (__stream == (FILE *)0x0) {
      lVar2 = -1;
    }
    else {
      fseek(__stream,0,2);
      lVar2 = ftell(__stream);
      fclose(__stream);
    }
    return lVar2;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Current user dir is error,now program will exit.")
  ;
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

long CSIZECommand::GetFileSize(CClient *pClient) {
    int r = chdir(pClient->GetUserDir().c_str());
    if(r == 0){
        FILE *file = fopen(m_Args.c_str(),"rb");
        if(file == NULL)
            return -1;
        else {
            fseek(file, 0, 2);
            long size = ftell(file);
            fclose(file);
            return size;
        }
    }
    else{
        cout << "Current user dir is error,now program will exit." << endl;
        exit(-1);
    }
}